

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_confined.cpp
# Opt level: O2

Reals __thiscall
Omega_h::get_edge_pad_dists<3>(Omega_h *this,Mesh *mesh,Read<signed_char> *edges_are_bridges)

{
  LO LVar1;
  void *extraout_RDX;
  Reals RVar2;
  allocator local_a9;
  Write<double> out;
  Write<signed_char> local_98;
  LOs edges2verts;
  Reals coords;
  type f;
  
  Mesh::coords((Mesh *)&coords);
  Mesh::ask_verts_of((Mesh *)&edges2verts,(Int)mesh);
  LVar1 = Mesh::nedges(mesh);
  std::__cxx11::string::string((string *)&f,"",&local_a9);
  Write<double>::Write(&out,LVar1,-1.0,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  Write<signed_char>::Write((Write<signed_char> *)&f,&edges_are_bridges->write_);
  Write<int>::Write(&f.edges2verts.write_,&edges2verts.write_);
  Write<double>::Write(&f.coords.write_,&coords.write_);
  Write<double>::Write(&f.out,&out);
  LVar1 = Mesh::nedges(mesh);
  parallel_for<Omega_h::get_edge_pad_dists<3>(Omega_h::Mesh*,Omega_h::Read<signed_char>)::_lambda(int)_1_&>
            (LVar1,&f);
  Write<double>::Write(&local_98,(Write<signed_char> *)&out);
  Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_98);
  Write<double>::~Write((Write<double> *)&local_98);
  get_edge_pad_dists<3>(Omega_h::Mesh*,Omega_h::Read<signed_char>)::{lambda(int)#1}::~Mesh
            ((_lambda_int__1_ *)&f);
  Write<double>::~Write(&out);
  Write<int>::~Write(&edges2verts.write_);
  Write<double>::~Write(&coords.write_);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals get_edge_pad_dists(Mesh* mesh, Read<I8> edges_are_bridges) {
  auto coords = mesh->coords();
  auto edges2verts = mesh->ask_verts_of(EDGE);
  auto out = Write<Real>(mesh->nedges(), -1.0);
  auto f = OMEGA_H_LAMBDA(LO edge) {
    if (!edges_are_bridges[edge]) return;
    auto eev2v = gather_verts<2>(edges2verts, edge);
    auto eev2x = gather_vectors<2, dim>(coords, eev2v);
    auto h = norm(eev2x[1] - eev2x[0]);
    out[edge] = h;
  };
  parallel_for(mesh->nedges(), f);
  return out;
}